

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase298::run(TestCase298 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  Schema SVar2;
  Schema schema;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_24f;
  bool local_220;
  ArrayPtr<const_char> local_218;
  Schema local_208;
  Reader local_200;
  ArrayPtr<const_char> local_1d0;
  SchemaLoader loader;
  Reader local_d0;
  LazyLoadCallback local_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  byte local_68;
  Reader local_60;
  
  __kjCondition = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto(&local_60,(Schema *)&_kjCondition);
  local_78 = local_60._reader.dataSize;
  SStack_74 = local_60._reader.pointerCount;
  uStack_72 = local_60._reader._38_2_;
  iStack_70 = local_60._reader.nestingLimit;
  uStack_6c = local_60._reader._44_4_;
  local_88 = local_60._reader.data;
  pWStack_80 = local_60._reader.pointers;
  local_98 = local_60._reader.segment;
  pCStack_90 = local_60._reader.capTable;
  local_a0._vptr_LazyLoadCallback = (_func_int **)&PTR_load_0064e980;
  local_68 = 0;
  SchemaLoader::SchemaLoader(&loader,&local_a0);
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  SchemaLoader::tryGet((SchemaLoader *)&local_200,(uint64_t)&loader,brand,(Schema)0x4d2);
  _kjCondition.value = (bool)(byte)local_200._reader.segment;
  if (((byte)local_200._reader.segment & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<capnp::Schema>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x12e,ERROR,
               "\"failed: expected \" \"loader.tryGet(1234) == kj::none\", _kjCondition",
               (char (*) [49])"failed: expected loader.tryGet(1234) == kj::none",
               (DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> *)&_kjCondition);
  }
  _kjCondition.value = (bool)(local_68 ^ 1);
  if ((local_68 == 1) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x130,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
               (char (*) [40])"failed: expected !(callback.isLoaded())",&_kjCondition);
  }
  auVar1 = ZEXT1640(ZEXT816(0));
  brand_00._reader._40_8_ = 0x7fffffff;
  brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand_00._reader.data = (void *)auVar1._16_8_;
  brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand_00._reader.dataSize = auVar1._32_4_;
  brand_00._reader.pointerCount = auVar1._36_2_;
  brand_00._reader._38_2_ = auVar1._38_2_;
  schema = SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand_00,(Schema)0x669c88);
  _kjCondition.value = (bool)local_68;
  if ((local_68 == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x132,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
               (char (*) [37])"failed: expected callback.isLoaded()",&_kjCondition);
  }
  Schema::getProto(&local_200,&schema);
  local_218 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_200);
  local_208.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto(&local_d0,&local_208);
  local_1d0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d0);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<capnp::Text::Reader> *)&local_218,(Reader *)&local_1d0);
  if ((local_220 == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_200,&schema);
    local_218 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_200);
    local_208.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
    Schema::getProto(&local_d0,&local_208);
    local_1d0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d0);
    kj::_::Debug::
    log<char_const(&)[116],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x135,ERROR,
               "\"failed: expected \" \"(schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, schema.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
               ,(char (*) [116])
                "failed: expected (schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
               (Reader *)&local_218,(Reader *)&local_1d0);
  }
  SVar2 = Schema::getDependency(&schema,0xa0a8f314b80b63fd);
  __kjCondition = (RawBrandedSchema *)&schema;
  if ((schema.raw != SVar2.raw) && (kj::_::Debug::minSeverity < 3)) {
    local_200._reader.segment = (SegmentReader *)Schema::getDependency(&schema,0xa0a8f314b80b63fd);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x137,ERROR,
               "\"failed: expected \" \"(schema) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, schema, schema.getDependency(typeId<TestAllTypes>())"
               ,(char (*) [76])
                "failed: expected (schema) == (schema.getDependency(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition,&schema,
               (Schema *)&local_200);
  }
  auVar1 = ZEXT1640(ZEXT816(0));
  brand_01._reader._40_8_ = 0x7fffffff;
  brand_01._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand_01._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand_01._reader.data = (void *)auVar1._16_8_;
  brand_01._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand_01._reader.dataSize = auVar1._32_4_;
  brand_01._reader.pointerCount = auVar1._36_2_;
  brand_01._reader._38_2_ = auVar1._38_2_;
  SVar2 = SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand_01,(Schema)0x669c88);
  __kjCondition = (RawBrandedSchema *)&schema;
  if ((schema.raw != SVar2.raw) && (kj::_::Debug::minSeverity < 3)) {
    auVar1 = ZEXT1640(ZEXT816(0));
    brand_02._reader._40_8_ = 0x7fffffff;
    brand_02._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand_02._reader.data = (void *)auVar1._16_8_;
    brand_02._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand_02._reader.dataSize = auVar1._32_4_;
    brand_02._reader.pointerCount = auVar1._36_2_;
    brand_02._reader._38_2_ = auVar1._38_2_;
    local_200._reader.segment =
         (SegmentReader *)SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand_02,(Schema)0x669c88);
    kj::_::Debug::
    log<char_const(&)[66],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x138,ERROR,
               "\"failed: expected \" \"(schema) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, schema, loader.get(typeId<TestAllTypes>())"
               ,(char (*) [66])"failed: expected (schema) == (loader.get(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition,&schema,
               (Schema *)&local_200);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoad) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  EXPECT_TRUE(loader.tryGet(1234) == kj::none);

  EXPECT_FALSE(callback.isLoaded());
  Schema schema = loader.get(typeId<TestAllTypes>());
  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(schema.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(schema, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(schema, loader.get(typeId<TestAllTypes>()));
}